

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompileType<long>(void)

{
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> s;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20.m_int = 0;
  CompiledMixedType<long,char>();
  CompiledMixedType<long,signed_char>();
  CompiledMixedType<long,unsigned_char>();
  CompiledMixedType<long,short>();
  CompiledMixedType<long,unsigned_short>();
  CompiledMixedType<long,int>();
  CompiledMixedType<long,unsigned_int>();
  CompiledMixedType<long,long>();
  CompiledMixedType<long,unsigned_long>();
  CompiledMixedType<long,long_long>();
  CompiledMixedType<long,unsigned_long_long>();
  ModulusFriendTest<long,char>();
  ModulusFriendTest<long,signed_char>();
  ModulusFriendTest<long,unsigned_char>();
  ModulusFriendTest<long,short>();
  ModulusFriendTest<long,unsigned_short>();
  ModulusFriendTest<long,int>();
  ModulusFriendTest<long,unsigned_int>();
  ModulusFriendTest<long,long>();
  ModulusFriendTest<long,unsigned_long>();
  ModulusFriendTest<long,long_long>();
  ModulusFriendTest<long,unsigned_long_long>();
  SafeInt::operator_cast_to_wchar_t((SafeInt *)&local_18);
  SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_18);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator++
            (&local_20,0);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator++
            (&local_20);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator--
            (&local_20,0);
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator--
            (&local_20);
  return;
}

Assistant:

void CompileType()
{
	// Test constructors
	SafeInt<T> s;
	SafeInt<T> i(Foo::Foo1);
	T t = 0;
	SafeInt<T> st(t);
	SafeInt<T> sb(false);

	// Mixed operations
	CompiledMixedType<T, char>();
	CompiledMixedType<T, signed char>();
	CompiledMixedType<T, unsigned char>();
	CompiledMixedType<T, short>();
	CompiledMixedType<T, unsigned short>();
	CompiledMixedType<T, int>();
	CompiledMixedType<T, unsigned int>();
	CompiledMixedType<T, long>();
	CompiledMixedType<T, unsigned long>();
	CompiledMixedType<T, long long>();
	CompiledMixedType<T, unsigned long long>();

	// This is making trouble for the compiler
	ModulusFriendTest<T, char>();
	ModulusFriendTest<T, signed char>();
	ModulusFriendTest<T, unsigned char>();
	ModulusFriendTest<T, short>();
	ModulusFriendTest<T, unsigned short>();
	ModulusFriendTest<T, int>();
	ModulusFriendTest<T, unsigned int>();
	ModulusFriendTest<T, long>();
	ModulusFriendTest<T, unsigned long>();
	ModulusFriendTest<T, long long>();
	ModulusFriendTest<T, unsigned long long>();
	
	// Special case casts
	bool b = (bool)s;
	wchar_t w = (wchar_t)s;
	size_t size = (size_t)s;
	float f = (float)s;
	double d = (double)s;
	long double ld = (long double)s;

	// Pointer operations
	T* p1 = s.Ptr();
	const T* p2 = s.Ptr();
	const T& r = s.Ref();
	T* p3 = &s;
	const T* p4 = &s;

	// Unary operators
	bool b2 = !st;
	t = +st;

	st++;
	++st;
	st--;
	--st;
	t = ~st;

	// Get compile time coverage of negation
	T x = 1;
	T result;

	(void)SafeNegation(x, result);

}